

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_X509.cpp
# Opt level: O0

bool __thiscall axl::cry::X509Store::create(X509Store *this)

{
  bool bVar1;
  X509_STORE *pXVar2;
  int in_ESI;
  Handle<x509_store_st_*,_axl::cry::FreeX509Store,_axl::sl::Zero<x509_store_st_*>_> *in_RDI;
  
  sl::Handle<x509_store_st_*,_axl::cry::FreeX509Store,_axl::sl::Zero<x509_store_st_*>_>::close
            (in_RDI,in_ESI);
  pXVar2 = X509_STORE_new();
  in_RDI->m_h = (x509_store_st *)pXVar2;
  bVar1 = completeWithLastCryptoError(0);
  return bVar1;
}

Assistant:

bool
X509Store::create() {
	close();
	m_h = X509_STORE_new();
	return completeWithLastCryptoError(m_h != NULL);
}